

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void auxsort(lua_State *L,int l,int u)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int n;
  
LAB_0010e9e0:
  if (l < u) {
    lua_rawgeti(L,1,l);
    lua_rawgeti(L,1,u);
    iVar1 = sort_comp(L,-1,-2);
    if (iVar1 == 0) {
      L->top = L->top + -2;
    }
    else {
      set2(L,l,u);
    }
    if (u - l != 1) {
      iVar1 = (l + u) / 2;
      lua_rawgeti(L,1,iVar1);
      lua_rawgeti(L,1,l);
      iVar2 = sort_comp(L,-2,-1);
      if (iVar2 == 0) {
        L->top = L->top + -1;
        lua_rawgeti(L,1,u);
        iVar2 = sort_comp(L,-1,-2);
        if (iVar2 == 0) {
          L->top = L->top + -2;
        }
        else {
          set2(L,iVar1,u);
        }
      }
      else {
        set2(L,iVar1,l);
      }
      if (u - l != 2) {
        lua_rawgeti(L,1,iVar1);
        lua_pushvalue(L,-1);
        iVar4 = u + -1;
        lua_rawgeti(L,1,iVar4);
        set2(L,iVar1,iVar4);
        iVar1 = iVar4;
        iVar2 = l;
        do {
          while( true ) {
            n = iVar2 + 1;
            lua_rawgeti(L,1,n);
            iVar3 = sort_comp(L,-1,-2);
            if (iVar3 == 0) break;
            if (u <= iVar2) {
LAB_0010ec4a:
              luaL_error(L,"invalid order function for sorting");
            }
            L->top = L->top + -1;
            iVar2 = n;
          }
          while( true ) {
            lua_rawgeti(L,1,iVar1 + -1);
            iVar3 = sort_comp(L,-3,-1);
            if (iVar3 == 0) break;
            if (iVar1 <= l) goto LAB_0010ec4a;
            L->top = L->top + -1;
            iVar1 = iVar1 + -1;
          }
          if (iVar1 <= n) goto LAB_0010ebc0;
          iVar1 = iVar1 + -1;
          set2(L,n,iVar1);
          iVar2 = n;
        } while( true );
      }
    }
  }
  return;
LAB_0010ebc0:
  L->top = L->top + -3;
  lua_rawgeti(L,1,iVar4);
  lua_rawgeti(L,1,n);
  set2(L,iVar4,n);
  iVar4 = iVar2 + 2;
  iVar1 = u;
  if (n - l < u - n) {
    iVar4 = l;
    iVar1 = iVar2;
    l = iVar2 + 2;
    iVar2 = u;
  }
  u = iVar2;
  auxsort(L,iVar4,iVar1);
  goto LAB_0010e9e0;
}

Assistant:

static void auxsort(lua_State*L,int l,int u){
while(l<u){
int i,j;
lua_rawgeti(L,1,l);
lua_rawgeti(L,1,u);
if(sort_comp(L,-1,-2))
set2(L,l,u);
else
lua_pop(L,2);
if(u-l==1)break;
i=(l+u)/2;
lua_rawgeti(L,1,i);
lua_rawgeti(L,1,l);
if(sort_comp(L,-2,-1))
set2(L,i,l);
else{
lua_pop(L,1);
lua_rawgeti(L,1,u);
if(sort_comp(L,-1,-2))
set2(L,i,u);
else
lua_pop(L,2);
}
if(u-l==2)break;
lua_rawgeti(L,1,i);
lua_pushvalue(L,-1);
lua_rawgeti(L,1,u-1);
set2(L,i,u-1);
i=l;j=u-1;
for(;;){
while(lua_rawgeti(L,1,++i),sort_comp(L,-1,-2)){
if(i>u)luaL_error(L,"invalid order function for sorting");
lua_pop(L,1);
}
while(lua_rawgeti(L,1,--j),sort_comp(L,-3,-1)){
if(j<l)luaL_error(L,"invalid order function for sorting");
lua_pop(L,1);
}
if(j<i){
lua_pop(L,3);
break;
}
set2(L,i,j);
}
lua_rawgeti(L,1,u-1);
lua_rawgeti(L,1,i);
set2(L,u-1,i);
if(i-l<u-i){
j=l;i=i-1;l=i+2;
}
else{
j=i+1;i=u;u=j-2;
}
auxsort(L,j,i);
}
}